

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O3

ON_Xform * __thiscall ON_Xform::operator=(ON_Xform *this,ON_Matrix *src)

{
  double **ppdVar1;
  double *pdVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  ON_Xform *pOVar8;
  ON_Xform *pOVar9;
  ulong uVar10;
  double (*padVar11) [4];
  ulong uVar12;
  byte bVar13;
  
  bVar13 = 0;
  uVar4 = ON_Matrix::RowCount(src);
  uVar5 = ON_Matrix::ColCount(src);
  pOVar8 = &IdentityTransformation;
  pOVar9 = this;
  for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
    pOVar9->m_xform[0][0] = pOVar8->m_xform[0][0];
    pOVar8 = (ON_Xform *)((long)pOVar8 + ((ulong)bVar13 * -2 + 1) * 8);
    pOVar9 = (ON_Xform *)((long)pOVar9 + ((ulong)bVar13 * -2 + 1) * 8);
  }
  if (0 < (int)uVar4) {
    uVar7 = 4;
    if ((int)uVar5 < 4) {
      uVar7 = (ulong)uVar5;
    }
    uVar3 = 4;
    if (uVar4 < 4) {
      uVar3 = uVar4;
    }
    ppdVar1 = src->m;
    uVar10 = 0;
    padVar11 = (double (*) [4])this;
    do {
      if (0 < (int)uVar5) {
        pdVar2 = ppdVar1[uVar10];
        uVar12 = 0;
        do {
          (*(double (*) [4])*padVar11)[uVar12] = pdVar2[uVar12];
          uVar12 = uVar12 + 1;
        } while (uVar7 != uVar12);
      }
      uVar10 = uVar10 + 1;
      padVar11 = padVar11 + 1;
    } while (uVar10 != uVar3);
  }
  return this;
}

Assistant:

ON_Xform& ON_Xform::operator=(const ON_Matrix& src)
{
  int i,j;
  i = src.RowCount();
  const int maxi = (i>4)?4:i;
  j = src.ColCount();
  const int maxj = (j>4)?4:j;
  *this = ON_Xform::IdentityTransformation;
  for ( i = 0; i < maxi; i++ ) for ( j = 0; j < maxj; j++ ) {
    m_xform[i][j] = src.m[i][j];
  }
  return *this;
}